

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sip_decomposer.cc
# Opt level: O0

HomomorphismResult *
gss::solve_sip_by_decomposition(InputGraph *pattern,InputGraph *target,HomomorphismParams *params)

{
  string_view label;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  long in_RCX;
  HomomorphismResult *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar8;
  loooong isolated_symmetry_multiplier;
  loooong solution_multiplier;
  loooong unmapped_target_vertices;
  int *p_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range3_1;
  type_conflict3 *t;
  type *p;
  iterator __end3;
  iterator __begin3;
  VertexToVertexMapping *__range3;
  VertexToVertexMapping sub_mapping;
  int i_2;
  set<int,_std::less<int>,_std::allocator<int>_> t_avail;
  HomomorphismParams *in_stack_00000328;
  InputGraph *in_stack_00000330;
  InputGraph *in_stack_00000338;
  value_type r_j;
  int j;
  value_type r_i;
  int i_1;
  int i;
  vector<int,_std::allocator<int>_> reduced_to_original;
  vector<int,_std::allocator<int>_> original_to_reduced;
  InputGraph reduced_pattern;
  set<int,_std::less<int>,_std::allocator<int>_> isolated_pattern_vertices;
  HomomorphismResult *result;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *b;
  const_iterator in_stack_fffffffffffffbf8;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *a;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  undefined2 in_stack_fffffffffffffc14;
  undefined1 in_stack_fffffffffffffc16;
  undefined1 in_stack_fffffffffffffc17;
  type_conflict tVar9;
  unsigned_long in_stack_fffffffffffffc28;
  _Rb_tree_iterator<std::pair<const_int,_int>_> in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  _Rb_tree_iterator<std::pair<const_int,_int>_> in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  local_2a8 [3];
  int local_23c;
  basic_string_view<char,_std::char_traits<char>_> local_238 [2];
  undefined4 local_214;
  _Base_ptr local_210;
  _Base_ptr local_208;
  _Base_ptr local_200;
  undefined1 local_1f8;
  _Base_ptr local_1f0;
  reference local_1e8;
  _Self local_1e0;
  _Self local_1d8;
  undefined1 *local_1d0;
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  type_conflict3 *local_1b8;
  type *local_1b0;
  reference local_1a8;
  _Self local_1a0;
  _Self local_198;
  undefined1 *local_190;
  undefined1 local_188 [48];
  _Base_ptr local_158;
  undefined1 local_150;
  int local_144;
  undefined1 local_c9;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  int local_9c;
  vector<int,_std::allocator<int>_> local_98 [3];
  undefined1 local_50 [48];
  long local_20;
  
  local_20 = in_RCX;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1552af);
  anon_unknown.dwarf_ab538::find_removable_isolated_pattern_vertices
            ((InputGraph *)
             CONCAT17(in_stack_fffffffffffffc17,
                      CONCAT16(in_stack_fffffffffffffc16,
                               CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
             (HomomorphismParams *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
             (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffc00);
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1552db);
  if (bVar1) {
    solve_homomorphism_problem(in_stack_00000338,in_stack_00000330,in_stack_00000328);
  }
  else {
    InputGraph::size((InputGraph *)0x1552f0);
    std::set<int,_std::less<int>,_std::allocator<int>_>::size
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x155306);
    InputGraph::has_vertex_labels((InputGraph *)0x155326);
    InputGraph::has_edge_labels((InputGraph *)0x15533c);
    InputGraph::InputGraph
              ((InputGraph *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
               (int)((ulong)in_stack_fffffffffffffc38._M_node >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffc38._M_node >> 0x18,0),
               SUB81((ulong)in_stack_fffffffffffffc38._M_node >> 0x10,0));
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x155382);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x15538f);
    for (local_9c = 0; iVar3 = local_9c, iVar2 = InputGraph::size((InputGraph *)0x1553b5),
        iVar3 < iVar2; local_9c = local_9c + 1) {
      sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffc00
                         ,(key_type *)in_stack_fffffffffffffbf8._M_node);
      if (sVar4 == 0) {
        sVar5 = std::vector<int,_std::allocator<int>_>::size(local_98);
        local_a4 = (undefined4)sVar5;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                   (value_type_conflict1 *)in_stack_fffffffffffffbe8);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00,
                   (value_type_conflict1 *)in_stack_fffffffffffffbf8._M_node);
      }
      else {
        local_a0 = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                   (value_type_conflict1 *)in_stack_fffffffffffffbe8);
      }
    }
    for (local_a8 = 0; iVar3 = local_a8, iVar2 = InputGraph::size((InputGraph *)0x1554d9),
        iVar3 < iVar2; local_a8 = local_a8 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                          (size_type)in_stack_fffffffffffffbe8);
      local_ac = *pvVar6;
      if (local_ac != -1) {
        for (local_b0 = 0; iVar3 = local_b0, iVar2 = InputGraph::size((InputGraph *)0x15555d),
            iVar3 < iVar2; local_b0 = local_b0 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                              (size_type)in_stack_fffffffffffffbe8);
          local_b4 = *pvVar6;
          if ((local_b4 != -1) &&
             (bVar1 = InputGraph::adjacent
                                ((InputGraph *)in_stack_fffffffffffffc00,
                                 (int)((ulong)in_stack_fffffffffffffbf8._M_node >> 0x20),
                                 (int)in_stack_fffffffffffffbf8._M_node), bVar1)) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8._M_node);
            label._M_str = in_stack_fffffffffffffc50;
            label._M_len = (size_t)in_stack_fffffffffffffc48._M_node;
            InputGraph::add_directed_edge
                      ((InputGraph *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                       (int)((ulong)in_stack_fffffffffffffc38._M_node >> 0x20),
                       (int)in_stack_fffffffffffffc38._M_node,label);
          }
        }
      }
    }
    local_c9 = 0;
    solve_homomorphism_problem(in_stack_00000338,in_stack_00000330,in_stack_00000328);
    std::set<int,_std::less<int>,_std::allocator<int>_>::size
              ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1556cb);
    std::__cxx11::to_string(in_stack_fffffffffffffc28);
    std::operator+((char *)in_stack_fffffffffffffbf8._M_node,in_stack_fffffffffffffbf0);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffc00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbf8._M_node);
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    bVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::empty
                      ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )0x155739);
    if (!bVar1) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x15574e);
      for (local_144 = 0; iVar3 = local_144, iVar2 = InputGraph::size((InputGraph *)0x155774),
          iVar3 < iVar2; local_144 = local_144 + 1) {
        pVar7 = std::set<int,std::less<int>,std::allocator<int>>::emplace<int&>
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           CONCAT17(in_stack_fffffffffffffc17,
                                    CONCAT16(in_stack_fffffffffffffc16,
                                             CONCAT24(in_stack_fffffffffffffc14,
                                                      in_stack_fffffffffffffc10))),
                           (int *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
        local_158 = (_Base_ptr)pVar7.first._M_node;
        local_150 = pVar7.second;
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::clear
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x155886);
      local_190 = local_188;
      local_198._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                     (in_stack_fffffffffffffbe8);
      local_1a0._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     (in_stack_fffffffffffffbe8);
      while (bVar1 = std::operator==(&local_198,&local_1a0), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_1a8 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*
                              ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x1558ed);
        local_1b0 = std::get<0ul,int_const,int>((pair<const_int,_int> *)0x155902);
        local_1b8 = std::get<1ul,int_const,int>((pair<const_int,_int> *)0x155917);
        std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                   (key_type *)in_stack_fffffffffffffbe8);
        std::vector<int,_std::allocator<int>_>::at
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                   (size_type)in_stack_fffffffffffffbe8);
        pVar8 = std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
                emplace<int&,int&>((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)in_stack_fffffffffffffc00,
                                   (int *)in_stack_fffffffffffffbf8._M_node,
                                   (int *)in_stack_fffffffffffffbf0);
        in_stack_fffffffffffffc48 = pVar8.first._M_node;
        in_stack_fffffffffffffc47 = pVar8.second;
        local_1c8 = in_stack_fffffffffffffc48._M_node;
        local_1c0 = in_stack_fffffffffffffc47;
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)in_stack_fffffffffffffbf0);
      }
      local_1d0 = local_50;
      local_1d8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbe8);
      local_1e0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbe8);
      while (bVar1 = std::operator==(&local_1d8,&local_1e0), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_1e8 = std::_Rb_tree_const_iterator<int>::operator*
                              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffbf0);
        local_1f0 = (_Base_ptr)
                    std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffffbe8);
        std::_Rb_tree_const_iterator<int>::operator*
                  ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffbf0);
        pVar8 = std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
                emplace<int_const&,int_const&>
                          ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8._M_node,
                           (int *)in_stack_fffffffffffffbf0);
        in_stack_fffffffffffffc38 = pVar8.first._M_node;
        local_1f8 = pVar8.second;
        local_200 = in_stack_fffffffffffffc38._M_node;
        local_208 = (_Base_ptr)
                    std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffffbe8);
        local_210 = (_Base_ptr)
                    std::set<int,std::less<int>,std::allocator<int>>::erase_abi_cxx11_
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffffbf0,in_stack_fffffffffffffbf8);
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffbf0);
      }
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x155b09);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x155b16);
    }
    tVar9 = false;
    if ((*(byte *)(local_20 + 0x20) & 1) != 0) {
      local_214 = 0;
      tVar9 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                          *)in_stack_fffffffffffffbf8._M_node,(int *)in_stack_fffffffffffffbf0);
    }
    if (tVar9 != false) {
      iVar3 = InputGraph::size((InputGraph *)0x155b8c);
      local_23c = InputGraph::size((InputGraph *)0x155b9f);
      local_23c = iVar3 - local_23c;
      in_stack_fffffffffffffc00 = local_238;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::number<int>((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                     *)in_stack_fffffffffffffc00,(int *)in_stack_fffffffffffffbf8._M_node,
                    in_stack_fffffffffffffbf0);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)in_stack_fffffffffffffbf0,
               (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                *)in_stack_fffffffffffffbe8);
      std::set<int,_std::less<int>,_std::allocator<int>_>::size
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x155bf5);
      a = local_2a8;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::number<unsigned_long>
                ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_fffffffffffffc00,(unsigned_long *)a,in_stack_fffffffffffffbf0);
      (anonymous_namespace)::
      n_choose_k<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x155c44);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x155c51);
      std::set<int,_std::less<int>,_std::allocator<int>_>::size
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x155c5e);
      b = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
           *)&stack0xfffffffffffffd08;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::number<unsigned_long>
                ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_fffffffffffffc00,(unsigned_long *)a,b);
      (anonymous_namespace)::
      factorial<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)in_stack_fffffffffffffc48._M_node);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x155ca5);
      boost::multiprecision::operator*(a,b);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::operator*=((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                    *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)in_stack_fffffffffffffc38._M_node);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x155cec);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x155cf9);
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x155d06);
    }
    local_c9 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00);
    InputGraph::~InputGraph((InputGraph *)0x155e05);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x155e7c);
  return in_RDI;
}

Assistant:

auto gss::solve_sip_by_decomposition(const InputGraph & pattern, const InputGraph & target,
    const HomomorphismParams & params) -> HomomorphismResult
{
    set<int> isolated_pattern_vertices;
    find_removable_isolated_pattern_vertices(pattern, params, isolated_pattern_vertices);

    if (! isolated_pattern_vertices.empty()) {
        InputGraph reduced_pattern(pattern.size() - isolated_pattern_vertices.size(), pattern.has_vertex_labels(),
            pattern.has_edge_labels());

        vector<int> original_to_reduced, reduced_to_original;

        for (int i = 0; i < pattern.size(); ++i) {
            if (isolated_pattern_vertices.count(i))
                original_to_reduced.push_back(-1);
            else {
                original_to_reduced.push_back(reduced_to_original.size());
                reduced_to_original.push_back(i);
            }
        }

        for (int i = 0; i < pattern.size(); ++i) {
            auto r_i = original_to_reduced.at(i);
            if (r_i == -1)
                continue;

            for (int j = 0; j < pattern.size(); ++j) {
                auto r_j = original_to_reduced.at(j);
                if (r_j == -1)
                    continue;

                if (pattern.adjacent(i, j))
                    reduced_pattern.add_directed_edge(r_i, r_j, "");
            }
        }
        auto result = solve_homomorphism_problem(reduced_pattern, target, params);

        result.extra_stats.emplace_back("isolated_pattern_vertices = " + to_string(isolated_pattern_vertices.size()));

        // fix up the result to be in the non-decomposed form
        if (! result.mapping.empty()) {
            // need to re-add isolated vertices, arbitrarily. what's available?
            set<int> t_avail;
            for (int i = 0; i < target.size(); ++i)
                t_avail.emplace(i);

            // convert back to original indices, and remove used vertices
            auto sub_mapping = result.mapping;
            result.mapping.clear();
            for (auto & [p, t] : sub_mapping) {
                t_avail.erase(t);
                result.mapping.emplace(reduced_to_original.at(p), t);
            }

            // add in isolated vertices
            for (auto & p : isolated_pattern_vertices) {
                result.mapping.emplace(p, *t_avail.begin());
                t_avail.erase(t_avail.begin());
            }
        }

        // fix up the solution count
        if (params.count_solutions && result.solution_count > 0) {
            loooong unmapped_target_vertices = target.size() - reduced_pattern.size();
            loooong solution_multiplier = n_choose_k<loooong>(unmapped_target_vertices, isolated_pattern_vertices.size());
            loooong isolated_symmetry_multiplier = factorial<loooong>(isolated_pattern_vertices.size());
            result.solution_count *= solution_multiplier * isolated_symmetry_multiplier;
        }

        return result;
    }
    else
        return solve_homomorphism_problem(pattern, target, params);
}